

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__on_seek_memory(void *pUserData,int offset,ma_dr_flac_seek_origin origin)

{
  ulong uVar1;
  ma_bool32 mVar2;
  ulong uVar3;
  
  uVar3 = (ulong)offset;
  mVar2 = 0;
  if ((long)uVar3 <= (long)*(ulong *)((long)pUserData + 8)) {
    if (origin == ma_dr_flac_seek_origin_current) {
      uVar3 = uVar3 + *(long *)((long)pUserData + 0x10);
      uVar1 = uVar3;
    }
    else {
      uVar1 = (ulong)(uint)offset;
    }
    if (uVar1 <= *(ulong *)((long)pUserData + 8)) {
      *(ulong *)((long)pUserData + 0x10) = uVar3;
      mVar2 = 1;
    }
  }
  return mVar2;
}

Assistant:

static ma_bool32 ma_dr_flac__on_seek_memory(void* pUserData, int offset, ma_dr_flac_seek_origin origin)
{
    ma_dr_flac__memory_stream* memoryStream = (ma_dr_flac__memory_stream*)pUserData;
    MA_DR_FLAC_ASSERT(memoryStream != NULL);
    MA_DR_FLAC_ASSERT(offset >= 0);
    if (offset > (ma_int64)memoryStream->dataSize) {
        return MA_FALSE;
    }
    if (origin == ma_dr_flac_seek_origin_current) {
        if (memoryStream->currentReadPos + offset <= memoryStream->dataSize) {
            memoryStream->currentReadPos += offset;
        } else {
            return MA_FALSE;
        }
    } else {
        if ((ma_uint32)offset <= memoryStream->dataSize) {
            memoryStream->currentReadPos = offset;
        } else {
            return MA_FALSE;
        }
    }
    return MA_TRUE;
}